

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

void DumpMakefileTests(cmLocalGenerator *lg,string *config,Value *result)

{
  bool bVar1;
  reference ppcVar2;
  undefined1 local_98 [8];
  Value tmp;
  cmTest *test;
  iterator __end1;
  iterator __begin1;
  vector<cmTest_*,_std::allocator<cmTest_*>_> *__range1;
  undefined1 local_40 [8];
  vector<cmTest_*,_std::allocator<cmTest_*>_> tests;
  cmMakefile *mf;
  Value *result_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  
  tests.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)cmLocalGenerator::GetMakefile(lg);
  std::vector<cmTest_*,_std::allocator<cmTest_*>_>::vector
            ((vector<cmTest_*,_std::allocator<cmTest_*>_> *)local_40);
  cmMakefile::GetTests
            ((cmMakefile *)
             tests.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,config,
             (vector<cmTest_*,_std::allocator<cmTest_*>_> *)local_40);
  __end1 = std::vector<cmTest_*,_std::allocator<cmTest_*>_>::begin
                     ((vector<cmTest_*,_std::allocator<cmTest_*>_> *)local_40);
  test = (cmTest *)
         std::vector<cmTest_*,_std::allocator<cmTest_*>_>::end
                   ((vector<cmTest_*,_std::allocator<cmTest_*>_> *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmTest_**,_std::vector<cmTest_*,_std::allocator<cmTest_*>_>_>
                                *)&test);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmTest_**,_std::vector<cmTest_*,_std::allocator<cmTest_*>_>_>::
              operator*(&__end1);
    tmp.limit_ = (ptrdiff_t)*ppcVar2;
    DumpCTestInfo((Value *)local_98,lg,(cmTest *)tmp.limit_,config);
    bVar1 = Json::Value::isNull((Value *)local_98);
    if (!bVar1) {
      Json::Value::append(result,(Value *)local_98);
    }
    Json::Value::~Value((Value *)local_98);
    __gnu_cxx::__normal_iterator<cmTest_**,_std::vector<cmTest_*,_std::allocator<cmTest_*>_>_>::
    operator++(&__end1);
  }
  std::vector<cmTest_*,_std::allocator<cmTest_*>_>::~vector
            ((vector<cmTest_*,_std::allocator<cmTest_*>_> *)local_40);
  return;
}

Assistant:

static void DumpMakefileTests(cmLocalGenerator* lg, const std::string& config,
                              Json::Value* result)
{
  auto mf = lg->GetMakefile();
  std::vector<cmTest*> tests;
  mf->GetTests(config, tests);
  for (auto test : tests) {
    Json::Value tmp = DumpCTestInfo(lg, test, config);
    if (!tmp.isNull()) {
      result->append(tmp);
    }
  }
}